

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyEdge(ON_MeshComponentRef *this,ON_MeshTopologyEdge **tope)

{
  uint uVar1;
  ON_MeshTopology *pOVar2;
  ON_MeshTopologyEdge *pOVar3;
  uint uVar4;
  
  uVar4 = 0xffffffff;
  if (((this->m_mesh_ci).m_type == meshtop_edge) && (-1 < (this->m_mesh_ci).m_index)) {
    pOVar2 = MeshTopology(this);
    if ((pOVar2 != (ON_MeshTopology *)0x0) &&
       (uVar1 = (this->m_mesh_ci).m_index, (int)uVar1 < (pOVar2->m_tope).m_count)) {
      pOVar3 = (pOVar2->m_tope).m_a + (int)uVar1;
      uVar4 = uVar1;
      goto LAB_00524b36;
    }
  }
  pOVar3 = (ON_MeshTopologyEdge *)0x0;
LAB_00524b36:
  *tope = pOVar3;
  return uVar4;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyEdge(
  const struct ON_MeshTopologyEdge*& tope
  ) const
{
  if ( ON_COMPONENT_INDEX::meshtop_edge == m_mesh_ci.m_type && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( top && m_mesh_ci.m_index < top->m_tope.Count() )
    {
      tope = &top->m_tope[m_mesh_ci.m_index];
      return (unsigned int)m_mesh_ci.m_index;
    }
  }
  tope = 0;
  return ON_UNSET_UINT_INDEX;
}